

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O0

void __thiscall helics::udp::UdpComms::queue_rx_function(UdpComms *this)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  __int_type_conflict _Var2;
  udp uVar3;
  action_t aVar4;
  char *__str;
  undefined8 in_RCX;
  int __oflag;
  sockaddr *__addr;
  CommsInterface *in_RDI;
  ActionMessage reply;
  ActionMessage cmd;
  string_view str;
  size_t len;
  error_code ignored_error;
  error_code error;
  endpoint remote_endp;
  vector<char,_std::allocator<char>_> data;
  system_error *anon_var_0;
  int tries;
  system_error *error_1;
  bool bindsuccess;
  milliseconds t_cnt;
  socket socket;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  undefined4 in_stack_fffffffffffff908;
  int in_stack_fffffffffffff90c;
  ActionMessage *in_stack_fffffffffffff910;
  __atomic_base<int> *in_stack_fffffffffffff918;
  allocator<char> *__str_00;
  ConnectionStatus status;
  CommsInterface *in_stack_fffffffffffff920;
  const_buffers_1 *in_stack_fffffffffffff928;
  basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *in_stack_fffffffffffff930;
  void *in_stack_fffffffffffff938;
  ActionMessage *in_stack_fffffffffffff940;
  udp in_stack_fffffffffffff968;
  string_view in_stack_fffffffffffff988;
  string *in_stack_fffffffffffff998;
  int local_644;
  ActionMessage *in_stack_fffffffffffff9d0;
  Time in_stack_fffffffffffff9d8;
  int local_57c;
  basic_string_view<char,_std::char_traits<char>_> local_4a8;
  mutable_buffer local_498;
  ActionMessage *local_488;
  error_code local_470 [2];
  allocator<char> local_441 [389];
  int local_2bc;
  int local_27c;
  undefined1 local_278 [31];
  byte local_259;
  undefined1 local_258 [12];
  int local_24c;
  basic_socket<asio::ip::udp,_asio::any_io_executor> local_248 [6];
  
  _Var2 = std::__atomic_base::operator_cast_to_int(in_stack_fffffffffffff918);
  if (_Var2 < 0) {
    std::future<int>::get((future<int> *)in_stack_fffffffffffff930);
    std::__atomic_base<int>::operator=
              ((__atomic_base<int> *)in_stack_fffffffffffff918,
               (__int_type_conflict)((ulong)in_stack_fffffffffffff910 >> 0x20));
  }
  _Var2 = std::__atomic_base::operator_cast_to_int(in_stack_fffffffffffff918);
  if (_Var2 < 0) {
    CommsInterface::setRxStatus
              (in_stack_fffffffffffff920,
               (ConnectionStatus)((ulong)in_stack_fffffffffffff918 >> 0x20));
  }
  else {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff920);
    gmlc::networking::AsioContextManager::getContextPointer(in_stack_fffffffffffff998);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff910);
    std::
    __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x39f8fb);
    gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x39f903);
    asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
    basic_datagram_socket<asio::io_context>
              ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)
               in_stack_fffffffffffff910,
               (io_context *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),0);
    uVar3 = udpnet(LOCAL);
    local_24c = uVar3.family_;
    asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::open
              (local_248,(char *)&local_24c,__oflag);
    memset(local_258,0,8);
    local_259 = 0;
    while (((local_259 ^ 0xff) & 1) != 0) {
      in_stack_fffffffffffff968 = udpnet(LOCAL);
      local_27c = in_stack_fffffffffffff968.family_;
      std::__atomic_base::operator_cast_to_int(in_stack_fffffffffffff918);
      asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffff920,
                 (udp *)in_stack_fffffffffffff918,
                 (port_type)((ulong)in_stack_fffffffffffff910 >> 0x30));
      asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::bind
                (local_248,(int)local_278,__addr,(socklen_t)in_RCX);
      local_259 = 1;
    }
    __str_00 = local_441;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff930,
               (size_type)in_stack_fffffffffffff928,(allocator_type *)in_stack_fffffffffffff920);
    std::allocator<char>::~allocator(local_441);
    asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
              ((basic_endpoint<asio::ip::udp> *)0x3a0493);
    CLI::std::error_code::error_code((error_code *)in_stack_fffffffffffff910);
    CLI::std::error_code::error_code((error_code *)in_stack_fffffffffffff910);
    CommsInterface::setRxStatus
              (in_stack_fffffffffffff920,(ConnectionStatus)((ulong)__str_00 >> 0x20));
    do {
      local_498 = (mutable_buffer)
                  asio::buffer<char,std::allocator<char>>
                            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff910);
      in_stack_fffffffffffff910 =
           (ActionMessage *)
           asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
           receive_from<asio::mutable_buffers_1>
                     (in_stack_fffffffffffff930,(mutable_buffers_1 *)in_stack_fffffffffffff928,
                      (endpoint_type *)in_stack_fffffffffffff920,
                      (message_flags)((ulong)__str_00 >> 0x20),
                      (error_code *)in_stack_fffffffffffff910);
      local_488 = in_stack_fffffffffffff910;
      bVar1 = std::error_code::operator_cast_to_bool(local_470);
      if (bVar1) {
        CommsInterface::setRxStatus
                  (in_stack_fffffffffffff920,(ConnectionStatus)((ulong)__str_00 >> 0x20));
        local_2bc = 1;
        goto LAB_003a08af;
      }
      if (local_488 == (ActionMessage *)0x5) {
        __str = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)0x3a05a6);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_4a8,__str,(size_type)local_488);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff920,
                   (char *)__str_00);
        __x._M_str = (char *)in_stack_fffffffffffff940;
        __x._M_len = (size_t)in_stack_fffffffffffff938;
        __y._M_str = (char *)in_stack_fffffffffffff930;
        __y._M_len = (size_t)in_stack_fffffffffffff928;
        bVar1 = std::operator==(__x,__y);
        if (bVar1) break;
      }
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0x3a0631);
      ActionMessage::ActionMessage
                (in_stack_fffffffffffff940,in_stack_fffffffffffff938,
                 (size_t)in_stack_fffffffffffff930);
      bVar1 = isValidCommand((ActionMessage *)0x3a0658);
      if (bVar1) {
        bVar1 = isProtocolCommand(in_stack_fffffffffffff910);
        if (bVar1) {
          if (local_57c == 0x16570bf) {
            local_2bc = 7;
          }
          else {
            NetworkCommsInterface::generateReplyToIncomingMessage
                      ((NetworkCommsInterface *)in_stack_fffffffffffff9d8.internalTimeCode,
                       in_stack_fffffffffffff9d0);
            if (local_644 == 0x9db) {
              local_2bc = 7;
            }
            else {
              aVar4 = ActionMessage::action((ActionMessage *)&stack0xfffffffffffff9b8);
              if (aVar4 != cmd_ignore) {
                ActionMessage::to_string_abi_cxx11_
                          ((ActionMessage *)
                           CONCAT44(uVar3.family_,in_stack_fffffffffffff968.family_));
                asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff910);
                asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
                send_to<asio::const_buffers_1>
                          (in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                           (endpoint_type *)in_stack_fffffffffffff920,
                           (message_flags)((ulong)__str_00 >> 0x20),
                           (error_code *)in_stack_fffffffffffff910);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff910);
              }
              local_2bc = 0;
            }
            ActionMessage::~ActionMessage(in_stack_fffffffffffff910);
            if (local_2bc == 0) goto LAB_003a082f;
          }
        }
        else {
          std::function<void_(helics::ActionMessage_&&)>::operator()
                    ((function<void_(helics::ActionMessage_&&)> *)in_stack_fffffffffffff910,
                     (ActionMessage *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908))
          ;
LAB_003a082f:
          local_2bc = 0;
        }
      }
      else {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff920,
                   (char *)__str_00);
        CommsInterface::logWarning(in_RDI,in_stack_fffffffffffff988);
        local_2bc = 6;
      }
      ActionMessage::~ActionMessage(in_stack_fffffffffffff910);
      in_stack_fffffffffffff90c = local_2bc;
    } while ((local_2bc == 0) || (local_2bc == 6));
    status = (ConnectionStatus)((ulong)__str_00 >> 0x20);
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_fffffffffffff910,
               SUB41((uint)in_stack_fffffffffffff90c >> 0x18,0));
    CommsInterface::setRxStatus(in_stack_fffffffffffff920,status);
    local_2bc = 0;
LAB_003a08af:
    CLI::std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff920);
    asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::~basic_datagram_socket
              ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)0x3a08c9);
    std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
              ((shared_ptr<gmlc::networking::AsioContextManager> *)0x3a08d6);
  }
  return;
}

Assistant:

void UdpComms::queue_rx_function()
{
    using gmlc::networking::makePortAddress;

    if (PortNumber < 0) {
        PortNumber = futurePort.get();
    }
    if (PortNumber < 0) {
        setRxStatus(ConnectionStatus::ERRORED);
        return;
    }
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    udp::socket socket(ioctx->getBaseContext());
    socket.open(udpnet(interfaceNetwork));
    std::chrono::milliseconds t_cnt{0};
    bool bindsuccess = false;
    while (!bindsuccess) {
        try {
            socket.bind(udp::endpoint(udpnet(interfaceNetwork), static_cast<uint16_t>(PortNumber)));
            bindsuccess = true;
        }
        catch (const std::system_error& error) {
            if ((autoPortNumber) &&
                (hasBroker)) {  // If we failed and we are on an automatically assigned port
                                // number,  just try a different port
                int tries = 0;
                while (!bindsuccess) {
                    ++PortNumber;
                    try {
                        socket.bind(udp::endpoint(udpnet(interfaceNetwork),
                                                  static_cast<uint16_t>(PortNumber)));
                        bindsuccess = true;
                    }
                    catch (const std::system_error&) {
                        ++tries;
                        if (tries > 10) {
                            break;
                        }
                    }
                }
                if (!bindsuccess) {
                    disconnecting = true;
                    logError(fmt::format("unable to bind socket {} :{}",
                                         makePortAddress(localTargetAddress, PortNumber),
                                         error.what()));
                    socket.close();
                    setRxStatus(ConnectionStatus::ERRORED);
                    return;
                }
                continue;
            }
            if (t_cnt == std::chrono::milliseconds(0)) {
                logWarning(fmt::format("bind error on UDP socket {} :{}",
                                       makePortAddress(localTargetAddress, PortNumber),
                                       error.what()));
            }
            std::this_thread::sleep_for(std::chrono::milliseconds(200));
            t_cnt += std::chrono::milliseconds(200);
            if (t_cnt > connectionTimeout) {
                disconnecting = true;
                logError(fmt::format("unable to bind socket {} :{}",
                                     makePortAddress(localTargetAddress, PortNumber),
                                     error.what()));
                socket.close();
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
    }

    std::vector<char> data(10192);
    udp::endpoint remote_endp;
    std::error_code error;
    std::error_code ignored_error;
    setRxStatus(ConnectionStatus::CONNECTED);
    while (true) {
        auto len = socket.receive_from(asio::buffer(data), remote_endp, 0, error);
        if (error) {
            setRxStatus(ConnectionStatus::ERRORED);
            return;
        }
        if (len == 5) {
            const std::string_view str(data.data(), len);
            if (str == "close") {
                break;
            }
        }
        ActionMessage cmd(reinterpret_cast<std::byte*>(data.data()), len);
        if (!isValidCommand(cmd)) {
            logWarning("invalid command received udp");
            continue;
        }
        if (isProtocolCommand(cmd)) {
            if (cmd.messageID == CLOSE_RECEIVER) {
                break;
            }
            auto reply = generateReplyToIncomingMessage(cmd);
            if (reply.messageID == DISCONNECT) {
                break;
            }
            if (reply.action() != CMD_IGNORE) {
                socket.send_to(asio::buffer(reply.to_string()), remote_endp, 0, ignored_error);
            }
        } else {
            ActionCallback(std::move(cmd));
        }
    }
    disconnecting = true;
    setRxStatus(ConnectionStatus::TERMINATED);
}